

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::start_object(json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,size_t len)

{
  pointer *pppbVar1;
  iterator __position;
  ulong uVar2;
  out_of_range *__return_storage_ptr__;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_38._M_dataplus._M_p._0_1_ = 1;
  local_58._M_dataplus._M_p =
       (pointer)handle_value<nlohmann::detail::value_t>(this,(value_t *)&local_38);
  __position._M_current =
       (this->ref_stack).
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ref_stack).
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>
    ::
    _M_realloc_insert<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>
              ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>
                *)&this->ref_stack,__position,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                **)&local_58);
  }
  else {
    *__position._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_58._M_dataplus._M_p;
    pppbVar1 = &(this->ref_stack).
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppbVar1 = *pppbVar1 + 1;
  }
  if (len != 0xffffffffffffffff) {
    uVar2 = (ulong)(this->ref_stack).
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]->m_type;
    uVar3 = 1;
    if (uVar2 < 3) {
      uVar3 = *(ulong *)(&DAT_00403d00 + uVar2 * 8);
    }
    if (uVar3 < len) {
      __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
      std::__cxx11::to_string(&local_38,len);
      std::operator+(&local_58,"excessive object size: ",&local_38);
      out_of_range::create(__return_storage_ptr__,0x198,&local_58);
      __cxa_throw(__return_storage_ptr__,&out_of_range::typeinfo,exception::~exception);
    }
  }
  return true;
}

Assistant:

bool start_object(std::size_t len) {
		ref_stack.push_back(handle_value(BasicJsonType::value_t::object));

		if (JSON_UNLIKELY(len != std::size_t(-1) and len > ref_stack.back()->max_size())) {
			JSON_THROW(out_of_range::create(408, "excessive object size: " + std::to_string(len)));
		}

		return true;
	}